

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsMessageSetDestination(HelicsMessage message,char *dest,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (err == (HelicsError *)0x0) {
    if (message == (HelicsMessage)0x0) {
      return;
    }
    if (*(short *)((long)message + 10) != 0xb3) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((message == (HelicsMessage)0x0) || (*(short *)((long)message + 10) != 0xb3)) {
      err->error_code = -4;
      err->message = "The message object was not valid";
      return;
    }
  }
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  if (dest == (char *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
               gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
               gHelicsEmptyStr_abi_cxx11_._M_string_length);
  }
  else {
    sVar2 = strlen(dest);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,dest,dest + sVar2);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)message + 0x70),&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void helicsMessageSetDestination(HelicsMessage message, const char* dest, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    mess->dest = AS_STRING(dest);
}